

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

void wabt::WriteFloatHex(char *buffer,size_t size,uint32_t bits)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  char *pcVar9;
  size_t __n;
  bool bVar10;
  char buffer_1 [20];
  undefined1 local_28 [24];
  
  puVar7 = (undefined4 *)local_28;
  uVar4 = bits >> 0x17 & 0xff;
  uVar2 = uVar4 - 0x7f;
  if ((int)bits < 0) {
    puVar7 = (undefined4 *)(local_28 + 1);
    local_28[0] = 0x2d;
  }
  uVar5 = bits & 0x7fffff;
  if (uVar2 == 0x80) {
    pbVar8 = (byte *)((long)puVar7 + 3);
    if (uVar5 == 0) {
      *puVar7 = 0x666e69;
    }
    else {
      *puVar7 = 0x6e616e;
      if (uVar5 != 0x400000) {
        pbVar8[0] = 0x3a;
        pbVar8[1] = 0x30;
        pbVar8[2] = 0x78;
        pbVar8[3] = 0;
        iVar3 = -8;
        do {
          uVar2 = uVar5 << 4;
          iVar3 = iVar3 + 1;
          bVar10 = uVar5 < 0x1000000;
          uVar5 = uVar2;
        } while (bVar10);
        pbVar8 = (byte *)((long)puVar7 + 6);
        for (; iVar3 != 0; iVar3 = iVar3 + 1) {
          *pbVar8 = "0123456789abcdef"[uVar2 >> 0x1c];
          pbVar8 = pbVar8 + 1;
          uVar2 = uVar2 << 4;
        }
      }
    }
  }
  else {
    *(undefined2 *)puVar7 = 0x7830;
    *(byte *)((long)puVar7 + 2) = (uVar4 == 0 && uVar5 == 0) ^ 0x31;
    if (uVar5 == 0) {
      pcVar9 = (char *)((long)puVar7 + 3);
    }
    else {
      uVar6 = uVar5 << 9;
      if (uVar4 == 0) {
        uVar2 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar2 = uVar2 ^ 0x1f;
        uVar6 = uVar6 << ((char)uVar2 + 1U & 0x1f);
        if (uVar2 == 0x1f) {
          uVar6 = 0;
        }
        uVar2 = -uVar2 - 0x7f;
      }
      *(undefined1 *)((long)puVar7 + 3) = 0x2e;
      pcVar9 = (char *)(puVar7 + 1);
      for (; uVar6 != 0; uVar6 = uVar6 << 4) {
        *pcVar9 = "0123456789abcdef"[uVar6 >> 0x1c];
        pcVar9 = pcVar9 + 1;
      }
    }
    pcVar1 = pcVar9 + 1;
    *pcVar9 = 'p';
    if (uVar4 == 0 && uVar5 == 0) {
      pcVar9[3] = '\0';
      pcVar1[0] = '+';
      pcVar1[1] = '0';
      pbVar8 = (byte *)(pcVar9 + 3);
    }
    else {
      if ((int)uVar2 < 0) {
        *pcVar1 = '-';
        uVar2 = -uVar2;
      }
      else {
        *pcVar1 = '+';
      }
      if ((int)uVar2 < 1000) {
        pbVar8 = (byte *)(pcVar9 + 2);
      }
      else {
        pcVar9[2] = '1';
        pbVar8 = (byte *)(pcVar9 + 3);
      }
      if (99 < (int)uVar2) {
        *pbVar8 = (char)(uVar2 / 100) + (char)(((ulong)uVar2 / 100) * 0x1999999a >> 0x20) * -10 |
                  0x30;
        pbVar8 = pbVar8 + 1;
      }
      if (9 < (int)uVar2) {
        *pbVar8 = (char)(uVar2 / 10) + (char)(((ulong)uVar2 / 10) * 0x1999999a >> 0x20) * -10 | 0x30
        ;
        pbVar8 = pbVar8 + 1;
      }
      *pbVar8 = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
      pbVar8 = pbVar8 + 1;
    }
  }
  __n = size - 1;
  if ((ulong)((long)pbVar8 - (long)local_28) < size) {
    __n = (long)pbVar8 - (long)local_28;
  }
  memcpy(buffer,local_28,__n);
  buffer[__n] = '\0';
  return;
}

Assistant:

void WriteFloatHex(char* buffer, size_t size, uint32_t bits) {
  return FloatWriter<float>::WriteHex(buffer, size, bits);
}